

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.hpp
# Opt level: O0

void __thiscall helics::Input::getValue_impl<bool>(void *param_1,byte *param_2)

{
  bool bVar1;
  defV val_1;
  defV val;
  data_view dv;
  Input *in_stack_00000250;
  double *in_stack_ffffffffffffff08;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  shared_ptr<units::precise_unit> *in_stack_ffffffffffffff20;
  undefined1 val_00;
  defV *in_stack_ffffffffffffff28;
  data_view *in_stack_ffffffffffffff30;
  defV *in_stack_ffffffffffffff40;
  undefined1 local_b0 [8];
  bool *in_stack_ffffffffffffff58;
  defV *in_stack_ffffffffffffff60;
  defV local_78 [2];
  byte *local_18;
  void *local_10;
  
  local_18 = param_2;
  local_10 = param_1;
  checkAndGetFedUpdate((Input *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  bVar1 = data_view::empty((data_view *)0x4402ce);
  if (bVar1) {
    helics::valueExtract(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  else {
    if (*(int *)((long)&(((data_view *)((long)param_1 + 0x40))->ref).
                        super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 4) == -1) {
      loadSourceInformation(in_stack_00000250);
    }
    if (*(int *)((long)&(((data_view *)((long)param_1 + 0x40))->ref).
                        super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 4) == 1) {
      in_stack_ffffffffffffff30 =
           (data_view *)
           doubleExtractAndConvert
                     (in_stack_ffffffffffffff30,
                      (shared_ptr<units::precise_unit> *)in_stack_ffffffffffffff28,
                      in_stack_ffffffffffffff20);
      val_00 = (undefined1)((ulong)in_stack_ffffffffffffff20 >> 0x38);
      in_stack_ffffffffffffff28 = local_78;
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::variant<double,void,void,double,void>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      helics::valueExtract(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      CLI::std::
      variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                  *)0x440386);
    }
    else if (*(int *)((long)&(((data_view *)((long)param_1 + 0x40))->ref).
                             super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + 4) == 2) {
      val_00 = (undefined1)((ulong)local_b0 >> 0x38);
      CLI::std::
      variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                 *)0x4403cb);
      integerExtractAndConvert
                (in_stack_ffffffffffffff40,(data_view *)param_1,
                 (shared_ptr<units::precise_unit> *)in_stack_ffffffffffffff30,
                 (shared_ptr<units::precise_unit> *)in_stack_ffffffffffffff28);
      helics::valueExtract(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      CLI::std::
      variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                  *)0x440413);
    }
    else {
      helics::valueExtract
                ((data_view *)
                 val.
                 super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                 .
                 super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                 .
                 super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                 .
                 super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                 .
                 super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                 .
                 super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                 ._M_u._16_8_,
                 val.
                 super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                 .
                 super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                 .
                 super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                 .
                 super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                 .
                 super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                 .
                 super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                 ._M_u._12_4_,
                 (bool *)val.
                         super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         .
                         super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                         .
                         super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                         .
                         super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                         .
                         super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                         .
                         super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                         ._M_u._M_first._M_storage);
      val_00 = (undefined1)((ulong)in_stack_ffffffffffffff20 >> 0x38);
    }
    if (((ulong)(((data_view *)((long)param_1 + 0x40))->ref).
                super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi & 1) == 0) {
      make_valid((bool)(*local_18 & 1));
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                   *)in_stack_ffffffffffffff30,(long *)in_stack_ffffffffffffff28);
    }
    else {
      bVar1 = changeDetected(in_stack_ffffffffffffff28,(bool)val_00,
                             (double)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      if (bVar1) {
        make_valid((bool)(*local_18 & 1));
        std::
        variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
        ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                     *)in_stack_ffffffffffffff30,(long *)in_stack_ffffffffffffff28);
      }
      else {
        helics::valueExtract(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
    }
  }
  *(undefined1 *)
   ((long)&(((data_view *)((long)param_1 + 0x40))->ref).
           super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi + 1) = 0;
  data_view::~data_view((data_view *)0x44055d);
  return;
}

Assistant:

void Input::getValue_impl(std::integral_constant<int, primaryType> /*V*/, X& out)
{
    auto dv = checkAndGetFedUpdate();
    if (!dv.empty()) {
        if (injectionType == DataType::HELICS_UNKNOWN) {
            loadSourceInformation();
        }

        if (injectionType == helics::DataType::HELICS_DOUBLE) {
            defV val = doubleExtractAndConvert(dv, inputUnits, outputUnits);
            valueExtract(val, out);
        } else if (injectionType == helics::DataType::HELICS_INT) {
            defV val;
            integerExtractAndConvert(val, dv, inputUnits, outputUnits);
            valueExtract(val, out);
        } else {
            valueExtract(dv, injectionType, out);
        }
        if (changeDetectionEnabled) {
            if (changeDetected(lastValue, out, delta)) {
                lastValue = make_valid(out);
            } else {
                valueExtract(lastValue, out);
            }
        } else {
            lastValue = make_valid(out);
        }
    } else {
        valueExtract(lastValue, out);
    }
    hasUpdate = false;
}